

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TablePrinter::TablePrinter
          (TablePrinter *this,ostream *os,
          vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
          *columnInfos)

{
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  *in_stack_ffffffffffffffb8;
  
  *in_RDI = in_RSI;
  clara::std::
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ::vector(in_RDX,in_stack_ffffffffffffffb8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(in_RDI + 4));
  *(undefined4 *)(in_RDI + 0x33) = 0xffffffff;
  *(undefined1 *)((long)in_RDI + 0x19c) = 0;
  return;
}

Assistant:

TablePrinter( std::ostream& os, std::vector<ColumnInfo> columnInfos )
    :   m_os( os ),
        m_columnInfos( std::move( columnInfos ) ) {}